

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_log_helper.h
# Opt level: O0

void __thiscall spdlog::details::async_log_helper::~async_log_helper(async_log_helper *this)

{
  async_msg local_78;
  async_log_helper *local_10;
  async_log_helper *this_local;
  
  local_10 = this;
  async_msg::async_msg(&local_78,terminate);
  push_msg(this,&local_78);
  async_msg::~async_msg(&local_78);
  std::thread::join();
  std::thread::~thread(&this->_worker_thread);
  std::function<void_()>::~function(&this->_worker_teardown_cb);
  std::function<void_()>::~function(&this->_worker_warmup_cb);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&this->_err_handler);
  mpmc_bounded_queue<spdlog::details::async_log_helper::async_msg>::~mpmc_bounded_queue(&this->_q);
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::~vector(&this->_sinks);
  std::shared_ptr<spdlog::formatter>::~shared_ptr(&this->_formatter);
  return;
}

Assistant:

inline spdlog::details::async_log_helper::~async_log_helper()
{
    try
    {
        push_msg(async_msg(async_msg_type::terminate));
        _worker_thread.join();
    }
    catch (...) // don't crash in destructor
    {
    }
}